

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.h
# Opt level: O1

CLdispatchX * __thiscall CLIntercept::dispatchX(CLIntercept *this,cl_platform_id platform)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  CLdispatchX *pCVar3;
  _Base_ptr p_Var4;
  key_type local_8;
  
  p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(cl_platform_id *)(p_Var2 + 1) < platform]) {
    if (*(cl_platform_id *)(p_Var2 + 1) >= platform) {
      p_Var4 = p_Var2;
    }
  }
  p_Var2 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (p_Var2 = p_Var4, platform < *(cl_platform_id *)(p_Var4 + 1))) {
    p_Var2 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var1) {
    local_8 = (key_type)0x0;
    pCVar3 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,&local_8);
  }
  else {
    pCVar3 = (CLdispatchX *)&p_Var2[1]._M_parent;
  }
  return pCVar3;
}

Assistant:

inline const CLdispatchX& CLIntercept::dispatchX( cl_platform_id platform ) const
{
    CLdispatchXMap::const_iterator iter = m_DispatchX.find(platform);
    if( iter != m_DispatchX.end() )
    {
        return iter->second;
    }
    else
    {
        return m_DispatchX.at(NULL);
    }
}